

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O3

void __thiscall
sptk::GaussianMixtureModeling::FloorVariance
          (GaussianMixtureModeling *this,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          )

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  long lVar5;
  Row local_58;
  long local_40;
  double local_38;
  
  iVar4 = this->num_mixture_;
  if (0 < iVar4) {
    iVar2 = this->num_order_;
    lVar5 = 0;
    do {
      local_40 = lVar5;
      if (-1 < iVar2) {
        iVar4 = -1;
        do {
          iVar4 = iVar4 + 1;
          local_58.matrix_ =
               (covariance_matrices->
               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
               _M_impl.super__Vector_impl_data._M_start + lVar5;
          local_58._vptr_Row = (_func_int **)&PTR__Row_0011ab50;
          local_58.row_ = iVar4;
          pdVar3 = SymmetricMatrix::Row::operator[](&local_58,iVar4);
          dVar1 = this->variance_floor_;
          if (*pdVar3 <= dVar1 && dVar1 != *pdVar3) {
            local_58.matrix_ =
                 (covariance_matrices->
                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
                 _M_impl.super__Vector_impl_data._M_start + lVar5;
            local_58._vptr_Row = (_func_int **)&PTR__Row_0011ab50;
            local_58.row_ = iVar4;
            local_38 = dVar1;
            pdVar3 = SymmetricMatrix::Row::operator[](&local_58,iVar4);
            *pdVar3 = local_38;
          }
          iVar2 = this->num_order_;
        } while (iVar4 < iVar2);
        iVar4 = this->num_mixture_;
      }
      lVar5 = local_40 + 1;
    } while (lVar5 < iVar4);
  }
  return;
}

Assistant:

void GaussianMixtureModeling::FloorVariance(
    std::vector<SymmetricMatrix>* covariance_matrices) const {
  for (int k(0); k < num_mixture_; ++k) {
    for (int l(0); l <= num_order_; ++l) {
      if ((*covariance_matrices)[k][l][l] < variance_floor_) {
        (*covariance_matrices)[k][l][l] = variance_floor_;
      }
    }
  }
}